

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_ahostop(compiler_state_t *cstate,u_char *eaddr,int dir)

{
  block *pbVar1;
  block *pbVar2;
  u_int offset;
  char *fmt;
  
  switch(dir) {
  case 0:
  case 3:
    pbVar1 = gen_ahostop(cstate,eaddr,1);
    pbVar2 = gen_ahostop(cstate,eaddr,2);
    gen_or(pbVar1,pbVar2);
    return pbVar2;
  case 1:
    offset = 0;
    goto LAB_0010eb1d;
  case 2:
    offset = 1;
LAB_0010eb1d:
    pbVar1 = gen_bcmp(cstate,OR_LINKHDR,offset,1,eaddr);
    return pbVar1;
  case 4:
    pbVar1 = gen_ahostop(cstate,eaddr,1);
    pbVar2 = gen_ahostop(cstate,eaddr,2);
    gen_and(pbVar1,pbVar2);
    return pbVar2;
  case 5:
    fmt = "\'addr1\' is only supported on 802.11";
    break;
  case 6:
    fmt = "\'addr2\' is only supported on 802.11";
    break;
  case 7:
    fmt = "\'addr3\' is only supported on 802.11";
    break;
  case 8:
    fmt = "\'addr4\' is only supported on 802.11";
    break;
  case 9:
    fmt = "\'ra\' is only supported on 802.11";
    break;
  case 10:
    fmt = "\'ta\' is only supported on 802.11";
    break;
  default:
    abort();
  }
  bpf_error(cstate,fmt);
}

Assistant:

static struct block *
gen_ahostop(compiler_state_t *cstate, const u_char *eaddr, int dir)
{
	register struct block *b0, *b1;

	switch (dir) {
	/* src comes first, different from Ethernet */
	case Q_SRC:
		return gen_bcmp(cstate, OR_LINKHDR, 0, 1, eaddr);

	case Q_DST:
		return gen_bcmp(cstate, OR_LINKHDR, 1, 1, eaddr);

	case Q_AND:
		b0 = gen_ahostop(cstate, eaddr, Q_SRC);
		b1 = gen_ahostop(cstate, eaddr, Q_DST);
		gen_and(b0, b1);
		return b1;

	case Q_DEFAULT:
	case Q_OR:
		b0 = gen_ahostop(cstate, eaddr, Q_SRC);
		b1 = gen_ahostop(cstate, eaddr, Q_DST);
		gen_or(b0, b1);
		return b1;

	case Q_ADDR1:
		bpf_error(cstate, "'addr1' is only supported on 802.11");
		break;

	case Q_ADDR2:
		bpf_error(cstate, "'addr2' is only supported on 802.11");
		break;

	case Q_ADDR3:
		bpf_error(cstate, "'addr3' is only supported on 802.11");
		break;

	case Q_ADDR4:
		bpf_error(cstate, "'addr4' is only supported on 802.11");
		break;

	case Q_RA:
		bpf_error(cstate, "'ra' is only supported on 802.11");
		break;

	case Q_TA:
		bpf_error(cstate, "'ta' is only supported on 802.11");
		break;
	}
	abort();
	/* NOTREACHED */
}